

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Induction.cpp
# Opt level: O2

ClauseStack * __thiscall
Inferences::InductionClauseIterator::produceClauses
          (ClauseStack *__return_storage_ptr__,InductionClauseIterator *this,Formula *hypothesis,
          InferenceRule rule,InductionContext *context,
          DHMap<unsigned_int,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2> *bindings)

{
  long lVar1;
  uint uVar2;
  FormulaUnit *pFVar3;
  ostream *poVar4;
  uint uVar5;
  __node_base *p_Var6;
  string local_2b0;
  Inference inf;
  NewCNF cnf;
  
  Shell::NewCNF::NewCNF(&cnf,0);
  cnf._forInduction = true;
  __return_storage_ptr__->_cursor = (Clause **)0x0;
  __return_storage_ptr__->_end = (Clause **)0x0;
  __return_storage_ptr__->_capacity = 0;
  __return_storage_ptr__->_stack = (Clause **)0x0;
  local_2b0._M_dataplus._M_p._0_1_ = 0;
  local_2b0._M_dataplus._M_p._1_1_ = rule;
  Kernel::Inference::Inference(&inf,(NonspecificInference0 *)&local_2b0);
  p_Var6 = &(context->_cls)._M_h._M_before_begin;
  uVar5 = 0;
  while (p_Var6 = p_Var6->_M_nxt, p_Var6 != (__node_base *)0x0) {
    uVar2 = *(uint *)&p_Var6[1]._M_nxt[1]._M_nxt >> 0x15 & 0x1f;
    if (uVar5 <= uVar2) {
      uVar5 = uVar2;
    }
  }
  inf._0_8_ = inf._0_8_ & 0xfffffffffc1fffff | (ulong)(uVar5 * 0x200000 + 0x200000 & 0x3e00000);
  pFVar3 = (FormulaUnit *)Kernel::FormulaUnit::operator_new(0x48);
  Kernel::FormulaUnit::FormulaUnit(pFVar3,hypothesis,&inf);
  if (((this->_opt->_showAll).super_OptionValue<bool>.super_AbstractOptionValue.field_0x92 != '\0')
     || (((this->_opt->_showInduction).super_OptionValue<bool>.super_AbstractOptionValue.field_0x92
         & 1) != 0)) {
    poVar4 = std::operator<<((ostream *)&std::cout,"[Induction] formula ");
    Kernel::FormulaUnit::toString_abi_cxx11_(&local_2b0,pFVar3);
    poVar4 = std::operator<<(poVar4,(string *)&local_2b0);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)&local_2b0);
  }
  pFVar3 = Shell::NNF::ennf(pFVar3);
  Shell::NewCNF::clausify(&cnf,pFVar3,__return_storage_ptr__,bindings);
  lVar1 = DAT_00a141a0;
  if ((byte)(rule + INTERNAL_GENERATING_INFERNCE_LAST) < 10) {
    *(int *)(DAT_00a141a0 +
            *(long *)(&DAT_0073c638 + (ulong)(byte)(rule + INTERNAL_GENERATING_INFERNCE_LAST) * 8))
         = *(int *)(DAT_00a141a0 +
                   *(long *)(&DAT_0073c638 +
                            (ulong)(byte)(rule + INTERNAL_GENERATING_INFERNCE_LAST) * 8)) + 1;
    if ((byte)(rule + BINARY_CONN_ELIMINATION) < 6) {
      *(int *)(lVar1 + *(long *)(&DAT_0073c688 + (ulong)(byte)(rule + BINARY_CONN_ELIMINATION) * 8))
           = *(int *)(lVar1 + *(long *)(&DAT_0073c688 +
                                       (ulong)(byte)(rule + BINARY_CONN_ELIMINATION) * 8)) + 1;
    }
  }
  Shell::NewCNF::~NewCNF(&cnf);
  return __return_storage_ptr__;
}

Assistant:

ClauseStack InductionClauseIterator::produceClauses(Formula* hypothesis, InferenceRule rule, const InductionContext& context, DHMap<unsigned, Term*>* bindings)
{
  NewCNF cnf(0);
  cnf.setForInduction();
  Stack<Clause*> hyp_clauses;
  Inference inf = NonspecificInference0(UnitInputType::AXIOM,rule);
  unsigned maxInductionDepth = 0;
  for (const auto& kv : context._cls) {
    maxInductionDepth = max(maxInductionDepth,kv.first->inference().inductionDepth());
  }
  inf.setInductionDepth(maxInductionDepth+1);
  FormulaUnit* fu = new FormulaUnit(hypothesis,inf);
  if(_opt.showInduction()){
    std::cout << "[Induction] formula " << fu->toString() << endl;
  }
  cnf.clausify(NNF::ennf(fu), hyp_clauses, bindings);

  switch (rule) {
    case InferenceRule::STRUCT_INDUCTION_AXIOM_ONE:
    case InferenceRule::STRUCT_INDUCTION_AXIOM_TWO:
    case InferenceRule::STRUCT_INDUCTION_AXIOM_THREE:
    case InferenceRule::STRUCT_INDUCTION_AXIOM_RECURSION:
      env.statistics->structInduction++;
      break;
    case InferenceRule::INT_INF_UP_INDUCTION_AXIOM:
    case InferenceRule::INT_INF_DOWN_INDUCTION_AXIOM:
      env.statistics->intInfInduction++;
      break;
    case InferenceRule::INT_FIN_UP_INDUCTION_AXIOM:
    case InferenceRule::INT_FIN_DOWN_INDUCTION_AXIOM:
      env.statistics->intFinInduction++;
      break;
    case InferenceRule::INT_DB_UP_INDUCTION_AXIOM:
    case InferenceRule::INT_DB_DOWN_INDUCTION_AXIOM:
      env.statistics->intDBInduction++;
      break;
    default:
      ;
  }
  switch (rule) {
    case InferenceRule::INT_INF_UP_INDUCTION_AXIOM:
      env.statistics->intInfUpInduction++;
      break;
    case InferenceRule::INT_INF_DOWN_INDUCTION_AXIOM:
      env.statistics->intInfDownInduction++;
      break;
    case InferenceRule::INT_FIN_UP_INDUCTION_AXIOM:
      env.statistics->intFinUpInduction++;
      break;
    case InferenceRule::INT_FIN_DOWN_INDUCTION_AXIOM:
      env.statistics->intFinDownInduction++;
      break;
    case InferenceRule::INT_DB_UP_INDUCTION_AXIOM:
      env.statistics->intDBUpInduction++;
      break;
    case InferenceRule::INT_DB_DOWN_INDUCTION_AXIOM:
      env.statistics->intDBDownInduction++;
      break;
    default:
      ;
  }

  return hyp_clauses;
}